

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O2

void __thiscall
peach::exception::PositionalError::PositionalError
          (PositionalError *this,size_t line,size_t position,string *exceptionClass,string *comment)

{
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::operator+(&local_a0,comment," at ");
  std::__cxx11::to_string(&local_c0,line);
  std::operator+(&local_80,&local_a0,&local_c0);
  std::operator+(&local_60,&local_80,":");
  std::__cxx11::to_string(&local_e0,position);
  std::operator+(&local_40,&local_60,&local_e0);
  PeachException::PeachException(&this->super_PeachException,exceptionClass,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  *(undefined ***)&this->super_PeachException = &PTR__PeachException_00141620;
  this->line_ = line;
  this->position_ = position;
  return;
}

Assistant:

PositionalError(std::size_t line,
                    std::size_t position,
                    const std::string &exceptionClass,
                    const std::string &comment)
        : PeachException(exceptionClass,
                         comment + " at " +
                             std::to_string(line) +
                             ":" + std::to_string(position)),
          line_(line),
          position_(position)
    {
    }